

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O0

void __thiscall KDReports::Test::testFirstLast(Test *this)

{
  bool bVar1;
  byte bVar2;
  Header *pHVar3;
  QFlags<KDReports::HeaderLocation> local_74;
  Header *local_70;
  Header *normalHeader;
  Header *local_60;
  Header *lastHeader;
  pointer local_50;
  HeaderMap *headers;
  QFlags<KDReports::HeaderLocation> local_34;
  Header *local_30;
  Header *firstHeader;
  Report report;
  unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_> uStack_18;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  KDReports::Report::Report((Report *)&firstHeader,(QObject *)0x0);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_34,FirstPage);
  local_30 = (Header *)KDReports::Report::header((QFlags *)&firstHeader);
  local_50 = std::
             unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>::
             operator->(&uStack_18);
  local_50 = local_50 + 0x78;
  bVar1 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::isEmpty
                    ((QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*> *)local_50);
  bVar2 = QTest::qVerify((bool)(~bVar1 & 1),"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x40);
  if ((bVar2 & 1) == 0) {
    lastHeader._4_4_ = 1;
  }
  else {
    pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,1);
    bVar1 = QTest::qCompare<KDReports::Header>
                      (pHVar3,local_30,"headers.headerForPage(1, 1)","&firstHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x41);
    if (bVar1) {
      pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,1);
      bVar1 = QTest::qCompare<KDReports::Header>
                        (pHVar3,local_30,"headers.headerForPage(1, 2)","&firstHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x42);
      if (bVar1) {
        pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,2);
        bVar1 = QTest::qCompare<KDReports::Header>
                          (pHVar3,(Header *)0x0,"headers.headerForPage(2, 2)","( Header * )nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x43);
        if (bVar1) {
          QFlags<KDReports::HeaderLocation>::QFlags
                    ((QFlags<KDReports::HeaderLocation> *)((long)&normalHeader + 4),LastPage);
          local_60 = (Header *)KDReports::Report::header((QFlags *)&firstHeader);
          pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,1);
          bVar1 = QTest::qCompare<KDReports::Header>
                            (pHVar3,local_30,"headers.headerForPage(1, 1)","&firstHeader",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                             ,0x45);
          if (bVar1) {
            pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,1);
            bVar1 = QTest::qCompare<KDReports::Header>
                              (pHVar3,local_30,"headers.headerForPage(1, 2)","&firstHeader",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                               ,0x46);
            if (bVar1) {
              pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,2);
              bVar1 = QTest::qCompare<KDReports::Header>
                                (pHVar3,local_60,"headers.headerForPage(2, 2)","&lastHeader",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                 ,0x47);
              if (bVar1) {
                pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,2);
                bVar1 = QTest::qCompare<KDReports::Header>
                                  (pHVar3,(Header *)0x0,"headers.headerForPage(2, 3)",
                                   "( Header * )nullptr",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                   ,0x48);
                if (bVar1) {
                  QFlags<KDReports::HeaderLocation>::QFlags(&local_74,AllPages);
                  local_70 = (Header *)KDReports::Report::header((QFlags *)&firstHeader);
                  pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,1);
                  bVar1 = QTest::qCompare<KDReports::Header>
                                    (pHVar3,local_30,"headers.headerForPage(1, 1)","&firstHeader",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                     ,0x4a);
                  if (bVar1) {
                    pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,2);
                    bVar1 = QTest::qCompare<KDReports::Header>
                                      (pHVar3,local_60,"headers.headerForPage(2, 2)","&lastHeader",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                       ,0x4b);
                    if (bVar1) {
                      pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,3);
                      bVar1 = QTest::qCompare<KDReports::Header>
                                        (pHVar3,local_60,"headers.headerForPage(3, 3)","&lastHeader"
                                         ,
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                         ,0x4c);
                      if (bVar1) {
                        pHVar3 = (Header *)KDReports::HeaderMap::headerForPage((int)local_50,2);
                        bVar1 = QTest::qCompare<KDReports::Header>
                                          (pHVar3,local_70,"headers.headerForPage(2, 3)",
                                           "&normalHeader",
                                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                                           ,0x4d);
                        if (bVar1) {
                          lastHeader._4_4_ = 0;
                        }
                        else {
                          lastHeader._4_4_ = 1;
                        }
                      }
                      else {
                        lastHeader._4_4_ = 1;
                      }
                    }
                    else {
                      lastHeader._4_4_ = 1;
                    }
                  }
                  else {
                    lastHeader._4_4_ = 1;
                  }
                }
                else {
                  lastHeader._4_4_ = 1;
                }
              }
              else {
                lastHeader._4_4_ = 1;
              }
            }
            else {
              lastHeader._4_4_ = 1;
            }
          }
          else {
            lastHeader._4_4_ = 1;
          }
        }
        else {
          lastHeader._4_4_ = 1;
        }
      }
      else {
        lastHeader._4_4_ = 1;
      }
    }
    else {
      lastHeader._4_4_ = 1;
    }
  }
  KDReports::Report::~Report((Report *)&firstHeader);
  return;
}

Assistant:

void testFirstLast()
    {
        Report report;
        Header &firstHeader = report.header(FirstPage);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader);
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
        Header &lastHeader = report.header(LastPage);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // only one page -> use first header
        QCOMPARE(headers.headerForPage(1, 2), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), ( Header * )nullptr);
        Header &normalHeader = report.header(AllPages);
        QCOMPARE(headers.headerForPage(1, 1), &firstHeader); // unchanged
        QCOMPARE(headers.headerForPage(2, 2), &lastHeader); // unchanged
        QCOMPARE(headers.headerForPage(3, 3), &lastHeader);
        QCOMPARE(headers.headerForPage(2, 3), &normalHeader);
    }